

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptArray.cpp
# Opt level: O0

void __thiscall Js::JavascriptArray::JavascriptArray(JavascriptArray *this,DynamicType *type)

{
  code *pcVar1;
  bool bVar2;
  TypeId TVar3;
  DynamicObject *pDVar4;
  ScriptContext *this_00;
  JavascriptLibrary *this_01;
  DynamicObject *pDVar5;
  undefined4 *puVar6;
  SparseArraySegmentBase **ppSVar7;
  DynamicType *type_local;
  JavascriptArray *this_local;
  
  ArrayObject::ArrayObject(&this->super_ArrayObject,type,false,0);
  (this->super_ArrayObject).super_DynamicObject.super_RecyclableObject.super_FinalizableObject.
  super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject = (_func_int **)&PTR_Finalize_01e019f8;
  Memory::WriteBarrierPtr<Js::SparseArraySegmentBase>::WriteBarrierPtr(&this->head);
  SegmentUnionType::SegmentUnionType((SegmentUnionType *)&(this->segmentUnion).lastUsedSegment);
  TVar3 = Js::Type::GetTypeId(&type->super_Type);
  if (TVar3 != TypeIds_Array) {
    TVar3 = Js::Type::GetTypeId(&type->super_Type);
    if (TVar3 != TypeIds_NativeIntArray) {
      TVar3 = Js::Type::GetTypeId(&type->super_Type);
      if (TVar3 != TypeIds_ArrayLast) {
        TVar3 = Js::Type::GetTypeId(&type->super_Type);
        if (TVar3 == TypeIds_ArrayLastWithES5) {
LAB_010bf59f:
          pDVar4 = (DynamicObject *)Js::Type::GetPrototype(&type->super_Type);
          this_00 = RecyclableObject::GetScriptContext((RecyclableObject *)this);
          this_01 = ScriptContext::GetLibrary(this_00);
          pDVar5 = JavascriptLibraryBase::GetArrayPrototype(&this_01->super_JavascriptLibraryBase);
          if (pDVar4 == pDVar5) goto LAB_010bf63c;
        }
        else {
          TVar3 = Js::Type::GetTypeId(&type->super_Type);
          if (TVar3 == TypeIds_Object) goto LAB_010bf59f;
        }
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                                    ,0x17f,
                                    "(type->GetTypeId() == TypeIds_Array || type->GetTypeId() == TypeIds_NativeIntArray || type->GetTypeId() == TypeIds_NativeFloatArray || ((type->GetTypeId() == TypeIds_ES5Array || type->GetTypeId() == TypeIds_Object) && type->GetPrototype() == GetScriptContext()->GetLibrary()->GetArrayPrototype()))"
                                    ,
                                    "type->GetTypeId() == TypeIds_Array || type->GetTypeId() == TypeIds_NativeIntArray || type->GetTypeId() == TypeIds_NativeFloatArray || ((type->GetTypeId() == TypeIds_ES5Array || type->GetTypeId() == TypeIds_Object) && type->GetPrototype() == GetScriptContext()->GetLibrary()->GetArrayPrototype())"
                                   );
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
  }
LAB_010bf63c:
  if ((EmptySegment->length == 0) && (EmptySegment->size == 0)) {
    ppSVar7 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                        ((WriteBarrierPtr *)&EmptySegment->next);
    if (*ppSVar7 == (SparseArraySegmentBase *)0x0) goto LAB_010bf6e4;
  }
  AssertCount = AssertCount + 1;
  Throw::LogAssert();
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 1;
  bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptArray.cpp"
                              ,0x180,
                              "(EmptySegment->length == 0 && EmptySegment->size == 0 && EmptySegment->next == __null)"
                              ,
                              "EmptySegment->length == 0 && EmptySegment->size == 0 && EmptySegment->next == NULL"
                             );
  if (!bVar2) {
    pcVar1 = (code *)invalidInstructionException();
    (*pcVar1)();
  }
  puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
  *puVar6 = 0;
LAB_010bf6e4:
  DynamicObject::InitArrayFlags((DynamicObject *)this,InitialArrayValue);
  SetHeadAndLastUsedSegment(this,EmptySegment);
  return;
}

Assistant:

JavascriptArray::JavascriptArray(DynamicType * type)
        : ArrayObject(type, false, 0)
    {
        Assert(type->GetTypeId() == TypeIds_Array || type->GetTypeId() == TypeIds_NativeIntArray || type->GetTypeId() == TypeIds_NativeFloatArray || ((type->GetTypeId() == TypeIds_ES5Array || type->GetTypeId() == TypeIds_Object) && type->GetPrototype() == GetScriptContext()->GetLibrary()->GetArrayPrototype()));
        Assert(EmptySegment->length == 0 && EmptySegment->size == 0 && EmptySegment->next == NULL);
        InitArrayFlags(DynamicObjectFlags::InitialArrayValue);
        SetHeadAndLastUsedSegment(const_cast<SparseArraySegmentBase *>(EmptySegment));

    }